

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2AddrModeImm12(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  
  uVar3 = Val >> 0xd & 0xf;
  uVar1 = MCInst_getOpcode(Inst);
  if (((0x15 < uVar1 - 0xa2b) || ((0x204001U >> (uVar1 - 0xa2b & 0x1f) & 1) == 0)) ||
     (DVar2 = MCDisassembler_Fail, uVar3 != 0xf)) {
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
    MCOperand_CreateImm0(Inst,(ulong)(Val & 0xfff));
    DVar2 = MCDisassembler_Success;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeT2AddrModeImm12(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);
	unsigned imm = fieldFromInstruction_4(Val, 0, 12);

	// Thumb stores cannot use PC as dest register.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2STRi12:
		case ARM_t2STRBi12:
		case ARM_t2STRHi12:
			if (Rn == 15)
				return MCDisassembler_Fail;
		default:
			break;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, imm);

	return S;
}